

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doh.c
# Opt level: O0

DOHcode rdata(uchar *doh,size_t dohlen,unsigned_short rdlength,unsigned_short type,int index,
             dohentry *d)

{
  DOHcode DVar1;
  DOHcode rc;
  dohentry *d_local;
  int index_local;
  unsigned_short type_local;
  unsigned_short rdlength_local;
  size_t dohlen_local;
  uchar *doh_local;
  
  if (type == 1) {
    if (rdlength != 4) {
      return DOH_DNS_RDATA_LEN;
    }
    DVar1 = store_a(doh,index,d);
  }
  else if (type == 5) {
    DVar1 = store_cname(doh,dohlen,index,d);
  }
  else {
    if (type != 0x1c) {
      return DOH_OK;
    }
    if (rdlength != 0x10) {
      return DOH_DNS_RDATA_LEN;
    }
    DVar1 = store_aaaa(doh,index,d);
  }
  if (DVar1 == DOH_OK) {
    return DOH_OK;
  }
  return DVar1;
}

Assistant:

static DOHcode rdata(unsigned char *doh,
                     size_t dohlen,
                     unsigned short rdlength,
                     unsigned short type,
                     int index,
                     struct dohentry *d)
{
  /* RDATA
     - A (TYPE 1):  4 bytes
     - AAAA (TYPE 28): 16 bytes
     - NS (TYPE 2): N bytes */
  DOHcode rc;

  switch(type) {
  case DNS_TYPE_A:
    if(rdlength != 4)
      return DOH_DNS_RDATA_LEN;
    rc = store_a(doh, index, d);
    if(rc)
      return rc;
    break;
  case DNS_TYPE_AAAA:
    if(rdlength != 16)
      return DOH_DNS_RDATA_LEN;
    rc = store_aaaa(doh, index, d);
    if(rc)
      return rc;
    break;
  case DNS_TYPE_CNAME:
    rc = store_cname(doh, dohlen, index, d);
    if(rc)
      return rc;
    break;
  default:
    /* unsupported type, just skip it */
    break;
  }
  return DOH_OK;
}